

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O0

void h_predictor_8x16xc(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left,int count)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 local_328;
  undefined8 local_318;
  undefined8 local_308;
  undefined8 local_2f8;
  undefined1 uStack_2e0;
  undefined1 uStack_2df;
  undefined1 uStack_2de;
  undefined1 uStack_2dd;
  undefined1 uStack_2d0;
  undefined1 uStack_2cf;
  undefined1 uStack_2ce;
  undefined1 uStack_2cd;
  int local_2b0;
  uint8_t *local_2a8;
  uint8_t *local_290;
  undefined1 local_278;
  undefined1 uStack_277;
  undefined1 uStack_276;
  undefined1 uStack_275;
  undefined1 uStack_274;
  undefined1 uStack_273;
  undefined1 uStack_272;
  undefined1 uStack_271;
  undefined4 uStack_250;
  undefined4 uStack_230;
  undefined1 uStack_200;
  undefined1 uStack_1ff;
  undefined1 uStack_1fe;
  undefined1 uStack_1fd;
  undefined1 uStack_1fc;
  undefined1 uStack_1fb;
  undefined1 uStack_1fa;
  undefined1 uStack_1f9;
  __m128i row3;
  __m128i row2;
  __m128i row1;
  __m128i row0;
  __m128i left_col_high;
  __m128i left_col_low;
  __m128i left_col;
  int i;
  int count_local;
  
  local_2a8 = left;
  local_290 = dst;
  for (local_2b0 = 0; local_2b0 < count; local_2b0 = local_2b0 + 1) {
    uVar1 = *(undefined8 *)local_2a8;
    uVar2 = *(undefined8 *)(local_2a8 + 8);
    local_278 = (undefined1)uVar1;
    uStack_277 = (undefined1)((ulong)uVar1 >> 8);
    uStack_276 = (undefined1)((ulong)uVar1 >> 0x10);
    uStack_275 = (undefined1)((ulong)uVar1 >> 0x18);
    uStack_274 = (undefined1)((ulong)uVar1 >> 0x20);
    uStack_273 = (undefined1)((ulong)uVar1 >> 0x28);
    uStack_272 = (undefined1)((ulong)uVar1 >> 0x30);
    uStack_271 = (undefined1)((ulong)uVar1 >> 0x38);
    uStack_200 = (undefined1)uVar2;
    uStack_1ff = (undefined1)((ulong)uVar2 >> 8);
    uStack_1fe = (undefined1)((ulong)uVar2 >> 0x10);
    uStack_1fd = (undefined1)((ulong)uVar2 >> 0x18);
    uStack_1fc = (undefined1)((ulong)uVar2 >> 0x20);
    uStack_1fb = (undefined1)((ulong)uVar2 >> 0x28);
    uStack_1fa = (undefined1)((ulong)uVar2 >> 0x30);
    uStack_1f9 = (undefined1)((ulong)uVar2 >> 0x38);
    auVar7[1] = local_278;
    auVar7[0] = local_278;
    auVar7[2] = uStack_277;
    auVar7[3] = uStack_277;
    auVar7[4] = uStack_276;
    auVar7[5] = uStack_276;
    auVar7[6] = uStack_275;
    auVar7[7] = uStack_275;
    auVar7[8] = uStack_274;
    auVar7[9] = uStack_274;
    auVar7[10] = uStack_273;
    auVar7[0xb] = uStack_273;
    auVar7[0xc] = uStack_272;
    auVar7[0xd] = uStack_272;
    auVar7[0xe] = uStack_271;
    auVar7[0xf] = uStack_271;
    auVar15 = pshuflw(auVar7,auVar7,0);
    auVar8[1] = local_278;
    auVar8[0] = local_278;
    auVar8[2] = uStack_277;
    auVar8[3] = uStack_277;
    auVar8[4] = uStack_276;
    auVar8[5] = uStack_276;
    auVar8[6] = uStack_275;
    auVar8[7] = uStack_275;
    auVar8[8] = uStack_274;
    auVar8[9] = uStack_274;
    auVar8[10] = uStack_273;
    auVar8[0xb] = uStack_273;
    auVar8[0xc] = uStack_272;
    auVar8[0xd] = uStack_272;
    auVar8[0xe] = uStack_271;
    auVar8[0xf] = uStack_271;
    auVar16 = pshuflw(auVar8,auVar8,0x55);
    auVar9[1] = local_278;
    auVar9[0] = local_278;
    auVar9[2] = uStack_277;
    auVar9[3] = uStack_277;
    auVar9[4] = uStack_276;
    auVar9[5] = uStack_276;
    auVar9[6] = uStack_275;
    auVar9[7] = uStack_275;
    auVar9[8] = uStack_274;
    auVar9[9] = uStack_274;
    auVar9[10] = uStack_273;
    auVar9[0xb] = uStack_273;
    auVar9[0xc] = uStack_272;
    auVar9[0xd] = uStack_272;
    auVar9[0xe] = uStack_271;
    auVar9[0xf] = uStack_271;
    auVar17 = pshuflw(auVar9,auVar9,0xaa);
    auVar10[1] = local_278;
    auVar10[0] = local_278;
    auVar10[2] = uStack_277;
    auVar10[3] = uStack_277;
    auVar10[4] = uStack_276;
    auVar10[5] = uStack_276;
    auVar10[6] = uStack_275;
    auVar10[7] = uStack_275;
    auVar10[8] = uStack_274;
    auVar10[9] = uStack_274;
    auVar10[10] = uStack_273;
    auVar10[0xb] = uStack_273;
    auVar10[0xc] = uStack_272;
    auVar10[0xd] = uStack_272;
    auVar10[0xe] = uStack_271;
    auVar10[0xf] = uStack_271;
    auVar18 = pshuflw(auVar10,auVar10,0xff);
    local_2f8 = auVar15._0_8_;
    *(undefined8 *)local_290 = local_2f8;
    local_290 = local_290 + stride;
    local_308 = auVar16._0_8_;
    *(undefined8 *)local_290 = local_308;
    local_290 = local_290 + stride;
    local_318 = auVar17._0_8_;
    *(undefined8 *)local_290 = local_318;
    local_290 = local_290 + stride;
    local_328 = auVar18._0_8_;
    *(undefined8 *)local_290 = local_328;
    local_290 = local_290 + stride;
    uStack_2d0 = (undefined1)uStack_230;
    uStack_2cf = (undefined1)((uint)uStack_230 >> 8);
    uStack_2ce = (undefined1)((uint)uStack_230 >> 0x10);
    uStack_2cd = (undefined1)((uint)uStack_230 >> 0x18);
    auVar11[1] = local_278;
    auVar11[0] = local_278;
    auVar11[2] = uStack_277;
    auVar11[3] = uStack_277;
    auVar11[4] = uStack_276;
    auVar11[5] = uStack_276;
    auVar11[6] = uStack_275;
    auVar11[7] = uStack_275;
    auVar11[8] = uStack_2d0;
    auVar11[9] = uStack_2cf;
    auVar11[10] = uStack_2ce;
    auVar11[0xb] = uStack_2cd;
    auVar11[0xc] = uStack_272;
    auVar11[0xd] = uStack_272;
    auVar11[0xe] = uStack_271;
    auVar11[0xf] = uStack_271;
    auVar15 = pshuflw(auVar11,auVar11,0);
    auVar12[1] = local_278;
    auVar12[0] = local_278;
    auVar12[2] = uStack_277;
    auVar12[3] = uStack_277;
    auVar12[4] = uStack_276;
    auVar12[5] = uStack_276;
    auVar12[6] = uStack_275;
    auVar12[7] = uStack_275;
    auVar12[8] = uStack_2d0;
    auVar12[9] = uStack_2cf;
    auVar12[10] = uStack_2ce;
    auVar12[0xb] = uStack_2cd;
    auVar12[0xc] = uStack_272;
    auVar12[0xd] = uStack_272;
    auVar12[0xe] = uStack_271;
    auVar12[0xf] = uStack_271;
    auVar16 = pshuflw(auVar12,auVar12,0x55);
    auVar13[1] = local_278;
    auVar13[0] = local_278;
    auVar13[2] = uStack_277;
    auVar13[3] = uStack_277;
    auVar13[4] = uStack_276;
    auVar13[5] = uStack_276;
    auVar13[6] = uStack_275;
    auVar13[7] = uStack_275;
    auVar13[8] = uStack_2d0;
    auVar13[9] = uStack_2cf;
    auVar13[10] = uStack_2ce;
    auVar13[0xb] = uStack_2cd;
    auVar13[0xc] = uStack_272;
    auVar13[0xd] = uStack_272;
    auVar13[0xe] = uStack_271;
    auVar13[0xf] = uStack_271;
    auVar17 = pshuflw(auVar13,auVar13,0xaa);
    auVar14[1] = local_278;
    auVar14[0] = local_278;
    auVar14[2] = uStack_277;
    auVar14[3] = uStack_277;
    auVar14[4] = uStack_276;
    auVar14[5] = uStack_276;
    auVar14[6] = uStack_275;
    auVar14[7] = uStack_275;
    auVar14[8] = uStack_2d0;
    auVar14[9] = uStack_2cf;
    auVar14[10] = uStack_2ce;
    auVar14[0xb] = uStack_2cd;
    auVar14[0xc] = uStack_272;
    auVar14[0xd] = uStack_272;
    auVar14[0xe] = uStack_271;
    auVar14[0xf] = uStack_271;
    auVar18 = pshuflw(auVar14,auVar14,0xff);
    local_2f8 = auVar15._0_8_;
    *(undefined8 *)local_290 = local_2f8;
    local_290 = local_290 + stride;
    local_308 = auVar16._0_8_;
    *(undefined8 *)local_290 = local_308;
    local_290 = local_290 + stride;
    local_318 = auVar17._0_8_;
    *(undefined8 *)local_290 = local_318;
    local_290 = local_290 + stride;
    local_328 = auVar18._0_8_;
    *(undefined8 *)local_290 = local_328;
    local_290 = local_290 + stride;
    auVar15[1] = uStack_200;
    auVar15[0] = uStack_200;
    auVar15[2] = uStack_1ff;
    auVar15[3] = uStack_1ff;
    auVar15[4] = uStack_1fe;
    auVar15[5] = uStack_1fe;
    auVar15[6] = uStack_1fd;
    auVar15[7] = uStack_1fd;
    auVar15[8] = uStack_1fc;
    auVar15[9] = uStack_1fc;
    auVar15[10] = uStack_1fb;
    auVar15[0xb] = uStack_1fb;
    auVar15[0xc] = uStack_1fa;
    auVar15[0xd] = uStack_1fa;
    auVar15[0xe] = uStack_1f9;
    auVar15[0xf] = uStack_1f9;
    auVar15 = pshuflw(auVar15,auVar15,0);
    auVar16[1] = uStack_200;
    auVar16[0] = uStack_200;
    auVar16[2] = uStack_1ff;
    auVar16[3] = uStack_1ff;
    auVar16[4] = uStack_1fe;
    auVar16[5] = uStack_1fe;
    auVar16[6] = uStack_1fd;
    auVar16[7] = uStack_1fd;
    auVar16[8] = uStack_1fc;
    auVar16[9] = uStack_1fc;
    auVar16[10] = uStack_1fb;
    auVar16[0xb] = uStack_1fb;
    auVar16[0xc] = uStack_1fa;
    auVar16[0xd] = uStack_1fa;
    auVar16[0xe] = uStack_1f9;
    auVar16[0xf] = uStack_1f9;
    auVar16 = pshuflw(auVar16,auVar16,0x55);
    auVar17[1] = uStack_200;
    auVar17[0] = uStack_200;
    auVar17[2] = uStack_1ff;
    auVar17[3] = uStack_1ff;
    auVar17[4] = uStack_1fe;
    auVar17[5] = uStack_1fe;
    auVar17[6] = uStack_1fd;
    auVar17[7] = uStack_1fd;
    auVar17[8] = uStack_1fc;
    auVar17[9] = uStack_1fc;
    auVar17[10] = uStack_1fb;
    auVar17[0xb] = uStack_1fb;
    auVar17[0xc] = uStack_1fa;
    auVar17[0xd] = uStack_1fa;
    auVar17[0xe] = uStack_1f9;
    auVar17[0xf] = uStack_1f9;
    auVar17 = pshuflw(auVar17,auVar17,0xaa);
    auVar18[1] = uStack_200;
    auVar18[0] = uStack_200;
    auVar18[2] = uStack_1ff;
    auVar18[3] = uStack_1ff;
    auVar18[4] = uStack_1fe;
    auVar18[5] = uStack_1fe;
    auVar18[6] = uStack_1fd;
    auVar18[7] = uStack_1fd;
    auVar18[8] = uStack_1fc;
    auVar18[9] = uStack_1fc;
    auVar18[10] = uStack_1fb;
    auVar18[0xb] = uStack_1fb;
    auVar18[0xc] = uStack_1fa;
    auVar18[0xd] = uStack_1fa;
    auVar18[0xe] = uStack_1f9;
    auVar18[0xf] = uStack_1f9;
    auVar18 = pshuflw(auVar18,auVar18,0xff);
    local_2f8 = auVar15._0_8_;
    *(undefined8 *)local_290 = local_2f8;
    local_290 = local_290 + stride;
    local_308 = auVar16._0_8_;
    *(undefined8 *)local_290 = local_308;
    local_290 = local_290 + stride;
    local_318 = auVar17._0_8_;
    *(undefined8 *)local_290 = local_318;
    local_290 = local_290 + stride;
    local_328 = auVar18._0_8_;
    *(undefined8 *)local_290 = local_328;
    local_290 = local_290 + stride;
    uStack_2e0 = (undefined1)uStack_250;
    uStack_2df = (undefined1)((uint)uStack_250 >> 8);
    uStack_2de = (undefined1)((uint)uStack_250 >> 0x10);
    uStack_2dd = (undefined1)((uint)uStack_250 >> 0x18);
    auVar3[1] = uStack_200;
    auVar3[0] = uStack_200;
    auVar3[2] = uStack_1ff;
    auVar3[3] = uStack_1ff;
    auVar3[4] = uStack_1fe;
    auVar3[5] = uStack_1fe;
    auVar3[6] = uStack_1fd;
    auVar3[7] = uStack_1fd;
    auVar3[8] = uStack_2e0;
    auVar3[9] = uStack_2df;
    auVar3[10] = uStack_2de;
    auVar3[0xb] = uStack_2dd;
    auVar3[0xc] = uStack_1fa;
    auVar3[0xd] = uStack_1fa;
    auVar3[0xe] = uStack_1f9;
    auVar3[0xf] = uStack_1f9;
    auVar15 = pshuflw(auVar3,auVar3,0);
    auVar4[1] = uStack_200;
    auVar4[0] = uStack_200;
    auVar4[2] = uStack_1ff;
    auVar4[3] = uStack_1ff;
    auVar4[4] = uStack_1fe;
    auVar4[5] = uStack_1fe;
    auVar4[6] = uStack_1fd;
    auVar4[7] = uStack_1fd;
    auVar4[8] = uStack_2e0;
    auVar4[9] = uStack_2df;
    auVar4[10] = uStack_2de;
    auVar4[0xb] = uStack_2dd;
    auVar4[0xc] = uStack_1fa;
    auVar4[0xd] = uStack_1fa;
    auVar4[0xe] = uStack_1f9;
    auVar4[0xf] = uStack_1f9;
    auVar16 = pshuflw(auVar4,auVar4,0x55);
    auVar5[1] = uStack_200;
    auVar5[0] = uStack_200;
    auVar5[2] = uStack_1ff;
    auVar5[3] = uStack_1ff;
    auVar5[4] = uStack_1fe;
    auVar5[5] = uStack_1fe;
    auVar5[6] = uStack_1fd;
    auVar5[7] = uStack_1fd;
    auVar5[8] = uStack_2e0;
    auVar5[9] = uStack_2df;
    auVar5[10] = uStack_2de;
    auVar5[0xb] = uStack_2dd;
    auVar5[0xc] = uStack_1fa;
    auVar5[0xd] = uStack_1fa;
    auVar5[0xe] = uStack_1f9;
    auVar5[0xf] = uStack_1f9;
    auVar17 = pshuflw(auVar5,auVar5,0xaa);
    auVar6[1] = uStack_200;
    auVar6[0] = uStack_200;
    auVar6[2] = uStack_1ff;
    auVar6[3] = uStack_1ff;
    auVar6[4] = uStack_1fe;
    auVar6[5] = uStack_1fe;
    auVar6[6] = uStack_1fd;
    auVar6[7] = uStack_1fd;
    auVar6[8] = uStack_2e0;
    auVar6[9] = uStack_2df;
    auVar6[10] = uStack_2de;
    auVar6[0xb] = uStack_2dd;
    auVar6[0xc] = uStack_1fa;
    auVar6[0xd] = uStack_1fa;
    auVar6[0xe] = uStack_1f9;
    auVar6[0xf] = uStack_1f9;
    auVar18 = pshuflw(auVar6,auVar6,0xff);
    local_2f8 = auVar15._0_8_;
    *(undefined8 *)local_290 = local_2f8;
    local_290 = local_290 + stride;
    local_308 = auVar16._0_8_;
    *(undefined8 *)local_290 = local_308;
    local_290 = local_290 + stride;
    local_318 = auVar17._0_8_;
    *(undefined8 *)local_290 = local_318;
    local_328 = auVar18._0_8_;
    *(undefined8 *)(local_290 + stride) = local_328;
    local_290 = local_290 + stride + stride;
    local_2a8 = local_2a8 + 0x10;
  }
  return;
}

Assistant:

static inline void h_predictor_8x16xc(uint8_t *dst, ptrdiff_t stride,
                                      const uint8_t *above, const uint8_t *left,
                                      int count) {
  (void)above;
  for (int i = 0; i < count; ++i) {
    const __m128i left_col = _mm_load_si128((__m128i const *)left);
    __m128i left_col_low = _mm_unpacklo_epi8(left_col, left_col);
    __m128i left_col_high = _mm_unpackhi_epi8(left_col, left_col);

    __m128i row0 = _mm_shufflelo_epi16(left_col_low, 0);
    __m128i row1 = _mm_shufflelo_epi16(left_col_low, 0x55);
    __m128i row2 = _mm_shufflelo_epi16(left_col_low, 0xaa);
    __m128i row3 = _mm_shufflelo_epi16(left_col_low, 0xff);
    _mm_storel_epi64((__m128i *)dst, row0);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row1);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row2);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row3);
    dst += stride;

    left_col_low = _mm_unpackhi_epi64(left_col_low, left_col_low);
    row0 = _mm_shufflelo_epi16(left_col_low, 0);
    row1 = _mm_shufflelo_epi16(left_col_low, 0x55);
    row2 = _mm_shufflelo_epi16(left_col_low, 0xaa);
    row3 = _mm_shufflelo_epi16(left_col_low, 0xff);
    _mm_storel_epi64((__m128i *)dst, row0);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row1);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row2);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row3);
    dst += stride;

    row0 = _mm_shufflelo_epi16(left_col_high, 0);
    row1 = _mm_shufflelo_epi16(left_col_high, 0x55);
    row2 = _mm_shufflelo_epi16(left_col_high, 0xaa);
    row3 = _mm_shufflelo_epi16(left_col_high, 0xff);
    _mm_storel_epi64((__m128i *)dst, row0);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row1);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row2);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row3);
    dst += stride;

    left_col_high = _mm_unpackhi_epi64(left_col_high, left_col_high);
    row0 = _mm_shufflelo_epi16(left_col_high, 0);
    row1 = _mm_shufflelo_epi16(left_col_high, 0x55);
    row2 = _mm_shufflelo_epi16(left_col_high, 0xaa);
    row3 = _mm_shufflelo_epi16(left_col_high, 0xff);
    _mm_storel_epi64((__m128i *)dst, row0);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row1);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row2);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row3);
    dst += stride;
    left += 16;
  }
}